

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  bool bVar7;
  ImU32 tab_id;
  int iVar8;
  int iVar9;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *it;
  size_t sVar10;
  char *pcVar11;
  uint uVar12;
  ImGuiTabItemFlags flags_00;
  int iVar13;
  ImGuiCol idx;
  byte bVar14;
  int iVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint uVar20;
  bool held;
  float local_94;
  ImVec2 local_90;
  bool *local_88;
  ImGuiContext *local_80;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  int local_6c;
  undefined1 local_68 [16];
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar16 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  tab_id = TabBarCalcTabID(tab_bar,label);
  if ((p_open == (bool *)0x0) || (*p_open != false)) {
    local_80 = pIVar16;
    local_88 = p_open;
    IVar6 = TabItemCalcSize(label,p_open != (bool *)0x0);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = IVar6.x;
    local_68._4_4_ = IVar6.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    it = TabBarFindTabByID(tab_bar,tab_id);
    local_90 = (ImVec2)it;
    if (it == (ImGuiTabItem *)0x0) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = -NAN;
      bb.Max.y = -NAN;
      ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
      it = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
      it->ID = tab_id;
      it->Width = (float)local_68._0_4_;
    }
    iVar8 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
    tab_bar->LastTabItemIdx = (short)iVar8;
    uVar12 = flags | 0x100000;
    if (local_88 != (bool *)0x0) {
      uVar12 = flags;
    }
    it->WidthContents = (float)local_68._0_4_;
    uVar4 = tab_bar->Flags;
    iVar13 = tab_bar->PrevFrameVisible + 1;
    iVar8 = local_80->FrameCount;
    iVar15 = it->LastFrameVisible + 1;
    it->LastFrameVisible = iVar8;
    it->Flags = uVar12;
    iVar5 = (tab_bar->TabsNames).Buf.Size;
    iVar9 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar9 = 0;
    }
    it->NameOffset = iVar9;
    sVar10 = strlen(label);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar10 + 1);
    pIVar16 = local_80;
    uVar20 = tab_bar->Flags;
    bVar14 = iVar15 < iVar8;
    if (iVar15 < iVar8) {
      if ((((uVar20 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
         ((iVar8 <= iVar13 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
    }
    else if ((uVar20 & 1) == 0) {
      fVar2 = tab_bar->OffsetNextTab;
      it->Offset = fVar2;
      tab_bar->OffsetNextTab = it->Width + (local_80->Style).ItemInnerSpacing.x + fVar2;
    }
    if (((uVar12 & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) {
      tab_bar->NextSelectedTabId = tab_id;
    }
    if (tab_bar->VisibleTabId == tab_id) {
      tab_bar->VisibleTabWasSubmitted = true;
      bVar17 = true;
    }
    else if ((tab_bar->SelectedTabId == 0 && iVar13 < iVar8) && ((tab_bar->Tabs).Size == 1)) {
      bVar17 = (uVar20 & 2) == 0;
    }
    else {
      bVar17 = false;
    }
    if ((iVar8 <= iVar15) || (local_90 != (ImVec2)0x0 && iVar13 < iVar8)) {
      if (tab_bar->SelectedTabId == tab_id) {
        it->LastFrameSelected = local_80->FrameCount;
      }
      local_90 = (this->DC).CursorPos;
      fVar2 = it->Width;
      IVar6 = (tab_bar->BarRect).Min;
      fVar18 = (float)(int)(it->Offset - tab_bar->ScrollingAnim) + IVar6.x;
      fVar19 = IVar6.y + 0.0;
      IVar6.y = fVar19;
      IVar6.x = fVar18;
      (this->DC).CursorPos = IVar6;
      bb.Max.x = fVar2 + fVar18;
      bb.Max.y = (float)local_68._4_4_ + fVar19;
      bb.Min.y = fVar19;
      bb.Min.x = fVar18;
      fVar2 = (tab_bar->BarRect).Min.x;
      fVar3 = (tab_bar->BarRect).Max.x;
      uVar20 = -(uint)(fVar18 < fVar2 || fVar3 < bb.Max.x);
      local_68._0_4_ = uVar20;
      local_6c = iVar8;
      if ((uVar20 & 1) != 0) {
        fStack_74 = fVar19 + -1.0;
        _hovered = (float)(~-(uint)(fVar2 <= fVar18) & (uint)fVar2 |
                          -(uint)(fVar2 <= fVar18) & (uint)fVar18);
        _held = fVar3;
        local_94 = bb.Max.y;
        PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
        fVar18 = bb.Min.x;
        fVar19 = bb.Min.y;
      }
      _hovered = bb.Max.x - fVar18;
      fStack_74 = bb.Max.y - fVar19;
      IVar6 = (this->DC).CursorMaxPos;
      ItemSize((ImVec2 *)&hovered,(pIVar16->Style).FramePadding.y);
      (this->DC).CursorMaxPos = IVar6;
      bVar7 = ItemAdd(&bb,tab_id,(ImRect *)0x0);
      if (!bVar7) {
        if ((local_68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          PopClipRect();
        }
        (this->DC).CursorPos = local_90;
        return bVar17;
      }
      bVar7 = ButtonBehavior(&bb,tab_id,&hovered,&held,(uint)pIVar16->DragDropActive << 0xc | 0x44);
      if (bVar7) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      hovered = (bool)(hovered | pIVar16->HoveredId == tab_id);
      if (held == false) {
        bVar7 = iVar15 < local_6c;
        SetItemAllowOverlap();
        bVar14 = held ^ 1U | bVar7;
        pIVar16 = local_80;
      }
      if (((((bVar14 & 1) == 0) && (bVar7 = IsMouseDragging(0,-1.0), bVar7)) &&
          (pIVar16->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
        fVar2 = (pIVar16->IO).MouseDelta.x;
        if ((0.0 <= fVar2) ||
           (pIVar1 = &(pIVar16->IO).MousePos, bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x)) {
          if ((fVar2 <= 0.0) || ((pIVar16->IO).MousePos.x <= bb.Max.x)) goto LAB_0014bb7a;
          iVar8 = 1;
        }
        else {
          iVar8 = -1;
        }
        TabBarQueueChangeTabOrder(tab_bar,it,iVar8);
      }
LAB_0014bb7a:
      draw_list = this->DrawList;
      idx = 0x22;
      if ((held == false) && (hovered == false)) {
        if (bVar17 == false) {
          idx = (uint)((uVar4 >> 0x15 & 1) == 0) * 3 + 0x21;
        }
        else {
          idx = (uint)((uVar4 >> 0x15 & 1) == 0) * 2 + 0x23;
        }
      }
      col = GetColorU32(idx,1.0);
      TabItemBackground(draw_list,&bb,flags_00,col);
      RenderNavHighlight(&bb,tab_id,1);
      bVar7 = IsItemHovered(8);
      if ((bVar7) &&
         ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      uVar4 = tab_bar->Flags;
      if (local_88 == (bool *)0x0) {
        close_button_id = 0;
      }
      else {
        close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)tab_id + 1));
      }
      bVar7 = TabItemLabelAndCloseButton
                        (draw_list,&bb,uVar4 >> 1 & 4 | uVar12,tab_bar->FramePadding,label,tab_id,
                         close_button_id);
      if ((local_88 != (bool *)0x0) && (bVar7)) {
        *local_88 = false;
        TabBarCloseTab(tab_bar,it);
      }
      if ((local_68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        PopClipRect();
      }
      (this->DC).CursorPos = local_90;
      if (pIVar16->HoveredId != tab_id) {
        return bVar17;
      }
      if (held != false) {
        return bVar17;
      }
      if (pIVar16->HoveredIdNotActiveTimer <= 0.5) {
        return bVar17;
      }
      bVar7 = IsItemHovered(0);
      if (!bVar7) {
        return bVar17;
      }
      if ((tab_bar->Flags & 0x20) != 0) {
        return bVar17;
      }
      pcVar11 = FindRenderedTextEnd(label,(char *)0x0);
      SetTooltip("%.*s",(ulong)(uint)((int)pcVar11 - (int)label),label);
      return bVar17;
    }
    PushItemFlag(0x18,true);
  }
  else {
    PushItemFlag(0x18,true);
    bVar17 = false;
  }
  bb.Max.x = -3.4028235e+38;
  bb.Max.y = -3.4028235e+38;
  bb.Min.x = 3.4028235e+38;
  bb.Min.y = 3.4028235e+38;
  ItemAdd(&bb,tab_id,(ImRect *)0x0);
  PopItemFlag();
  return bVar17;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}